

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::BaseTimeCoordinator::BaseTimeCoordinator
          (BaseTimeCoordinator *this,
          function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction)

{
  bool bVar1;
  TimeDependencies *in_RSI;
  anon_class_1_0_00000001 *in_RDI;
  function<void_(const_helics::ActionMessage_&)> *unaff_retaddr;
  function<void_(const_helics::ActionMessage_&)> *in_stack_ffffffffffffffd8;
  anon_class_1_0_00000001 *__f;
  
  *(undefined ***)in_RDI = &PTR__BaseTimeCoordinator_0092f6b0;
  __f = in_RDI;
  TimeDependencies::TimeDependencies(in_RSI);
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_RSI,in_stack_ffffffffffffffd8);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 0x48),0);
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  in_RDI[0x50] = (anon_class_1_0_00000001)0x1;
  in_RDI[0x51] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x52] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x53] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x54] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x55] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x56] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x57] = (anon_class_1_0_00000001)0x0;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_helics::ActionMessage_&)> *)in_RSI);
  if (!bVar1) {
    std::function<void(helics::ActionMessage_const&)>::operator=(unaff_retaddr,__f);
  }
  return;
}

Assistant:

BaseTimeCoordinator::BaseTimeCoordinator(
    std::function<void(const ActionMessage&)> userSendMessageFunction):
    sendMessageFunction(std::move(userSendMessageFunction))
{
    if (!sendMessageFunction) {
        sendMessageFunction = nullMessageFunction;
    }
}